

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void mg_send_mime_file2(mg_connection *conn,char *path,char *mime_type,char *additional_headers)

{
  int iVar1;
  undefined1 local_50 [8];
  mg_file file;
  char *additional_headers_local;
  char *mime_type_local;
  char *path_local;
  mg_connection *conn_local;
  
  file.access.fp = (FILE *)additional_headers;
  memset(local_50,0,0x28);
  if (conn != (mg_connection *)0x0) {
    iVar1 = mg_stat(conn,path,(mg_file_stat *)local_50);
    if (iVar1 == 0) {
      mg_send_http_error(conn,0x194,"%s","Error: File not found");
    }
    else if ((int)file.stat.last_modified == 0) {
      handle_static_file_request(conn,path,(mg_file *)local_50,mime_type,(char *)file.access.fp);
    }
    else {
      iVar1 = mg_strcasecmp(conn->dom_ctx->config[0x21],"yes");
      if (iVar1 == 0) {
        handle_directory_request(conn,path);
      }
      else {
        mg_send_http_error(conn,0x193,"%s","Error: Directory listing denied");
      }
    }
  }
  return;
}

Assistant:

CIVETWEB_API void
mg_send_mime_file2(struct mg_connection *conn,
                   const char *path,
                   const char *mime_type,
                   const char *additional_headers)
{
	struct mg_file file = STRUCT_FILE_INITIALIZER;

	if (!conn) {
		/* No conn */
		return;
	}

	if (mg_stat(conn, path, &file.stat)) {
#if !defined(NO_CACHING)
		if (is_not_modified(conn, &file.stat)) {
			/* Send 304 "Not Modified" - this must not send any body data */
			handle_not_modified_static_file_request(conn, &file);
		} else
#endif /* NO_CACHING */
		    if (file.stat.is_directory) {
			if (!mg_strcasecmp(conn->dom_ctx->config[ENABLE_DIRECTORY_LISTING],
			                   "yes")) {
				handle_directory_request(conn, path);
			} else {
				mg_send_http_error(conn,
				                   403,
				                   "%s",
				                   "Error: Directory listing denied");
			}
		} else {
			handle_static_file_request(
			    conn, path, &file, mime_type, additional_headers);
		}
	} else {
		mg_send_http_error(conn, 404, "%s", "Error: File not found");
	}
}